

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void * raviX_ptrlist_delete_last(PtrList **self)

{
  ushort uVar1;
  PtrList *pPVar2;
  PtrList *pPVar3;
  PtrList *pPVar4;
  ushort uVar5;
  void *pvVar6;
  
  pPVar2 = *self;
  if (pPVar2 == (PtrList *)0x0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pPVar3 = pPVar2->prev_;
    uVar5 = *(ushort *)pPVar3;
    if ((char)uVar5 == '\0') {
      pvVar6 = (void *)0x0;
    }
    else {
      uVar1 = uVar5 - 1;
      uVar5 = uVar5 & 0xff00 | uVar1 & 0xff;
      *(ushort *)pPVar3 = uVar5;
      pvVar6 = pPVar3->list_[(char)uVar1];
    }
    if ((char)uVar5 < '\x01') {
      pPVar4 = pPVar3->prev_;
      pPVar2->prev_ = pPVar4;
      pPVar4->next_ = pPVar2;
      if (pPVar3 == pPVar2) {
        *self = (PtrList *)0x0;
      }
      (*pPVar3->allocator_->free)(pPVar3->allocator_->arena,pPVar3);
    }
  }
  return pvVar6;
}

Assistant:

void *raviX_ptrlist_delete_last(PtrList **self)
{
	void *ptr = NULL;
	PtrList *last, *first = *self;

	if (!first)
		return NULL;
	last = first->prev_;
	if (last->nr_)
		ptr = last->list_[--last->nr_];
	if (last->nr_ <= 0) {
		first->prev_ = last->prev_;
		last->prev_->next_ = first;
		if (last == first)
			*self = NULL;
		C_MemoryAllocator *alloc = last->allocator_;
		alloc->free(alloc->arena, last);
	}
	return ptr;
}